

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTextureNonProjected
               (SurfaceAccess *dst,Texture1DView *rawSrc,Vec4 *sq,ReferenceParams *params)

{
  float v1;
  int iVar1;
  int y_;
  float *pfVar2;
  float fVar3;
  Texture1DView TVar4;
  float local_140;
  float local_13c;
  float local_fc;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  Vec4 local_c4;
  float local_b4;
  float local_b0;
  float lod;
  float s;
  float triY;
  float triX;
  int triNdx;
  float xf;
  float yf;
  int x;
  int y;
  float triLod [2];
  Vec3 triS [2];
  int srcSize;
  IVec2 dstSize;
  float lodBias;
  undefined1 local_50 [8];
  Texture1DView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *params_local;
  Vec4 *sq_local;
  Texture1DView *rawSrc_local;
  SurfaceAccess *dst_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar4 = tcu::getEffectiveTextureView
                    (rawSrc,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             *)&src.m_levels,&params->sampler);
  src._0_8_ = TVar4.m_levels;
  local_50._0_4_ = TVar4.m_numLevels;
  if (((params->super_RenderParams).flags & 2) == 0) {
    local_fc = 0.0;
  }
  else {
    local_fc = (params->super_RenderParams).bias;
  }
  dstSize.m_data[0] = (int)local_fc;
  iVar1 = tcu::SurfaceAccess::getWidth(dst);
  y_ = tcu::SurfaceAccess::getHeight(dst);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffff98,iVar1,y_);
  triS[1].m_data[2] = (float)tcu::Texture1DView::getWidth((Texture1DView *)local_50);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)triLod,(int)sq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)sq,3,2);
  fVar3 = computeNonProjectedTriLod
                    (params->lodMode,(IVec2 *)&stack0xffffffffffffff98,(deInt32)triS[1].m_data[2],
                     (Vec3 *)triLod);
  x = (int)de::clamp<float>(fVar3 + (float)dstSize.m_data[0],params->minLod,params->maxLod);
  fVar3 = computeNonProjectedTriLod
                    (params->lodMode,(IVec2 *)&stack0xffffffffffffff98,(deInt32)triS[1].m_data[2],
                     (Vec3 *)(triS[0].m_data + 1));
  y = (int)de::clamp<float>(fVar3 + (float)dstSize.m_data[0],params->minLod,params->maxLod);
  for (yf = 0.0; fVar3 = yf, iVar1 = tcu::SurfaceAccess::getHeight(dst), (int)fVar3 < iVar1;
      yf = (float)((int)yf + 1)) {
    for (xf = 0.0; fVar3 = xf, iVar1 = tcu::SurfaceAccess::getWidth(dst), (int)fVar3 < iVar1;
        xf = (float)((int)xf + 1)) {
      fVar3 = (float)(int)yf;
      iVar1 = tcu::SurfaceAccess::getHeight(dst);
      triNdx = (int)((fVar3 + 0.5) / (float)iVar1);
      fVar3 = (float)(int)xf;
      iVar1 = tcu::SurfaceAccess::getWidth(dst);
      triX = (fVar3 + 0.5) / (float)iVar1;
      triY = (float)(uint)(1.0 <= triX + (float)triNdx);
      local_13c = triX;
      if (triY != 0.0) {
        local_13c = 1.0 - triX;
      }
      s = local_13c;
      if (triY == 0.0) {
        local_140 = (float)triNdx;
      }
      else {
        local_140 = 1.0 - (float)triNdx;
      }
      lod = local_140;
      pfVar2 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      fVar3 = *pfVar2;
      pfVar2 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      v1 = *pfVar2;
      pfVar2 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(triS[(long)(int)triY + -1].m_data + 1))
      ;
      local_b0 = triangleInterpolate(fVar3,v1,*pfVar2,s,lod);
      local_b4 = (float)(&x)[(int)triY];
      execSample((TextureTestUtil *)&local_e4,(Texture1DView *)local_50,params,local_b0,local_b4);
      tcu::operator*((tcu *)&local_d4,&local_e4,&(params->super_RenderParams).colorScale);
      tcu::operator+((tcu *)&local_c4,&local_d4,&(params->super_RenderParams).colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_c4,(int)xf,(int)yf);
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return;
}

Assistant:

static void sampleTextureNonProjected (const tcu::SurfaceAccess& dst, const tcu::Texture1DView& rawSrc, const tcu::Vec4& sq, const ReferenceParams& params)
{
	// Separate combined DS formats
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DView					src					= getEffectiveTextureView(rawSrc, srcLevelStorage, params.sampler);

	float										lodBias				= (params.flags & ReferenceParams::USE_BIAS) ? params.bias : 0.0f;

	tcu::IVec2									dstSize				= tcu::IVec2(dst.getWidth(), dst.getHeight());
	int											srcSize				= src.getWidth();

	// Coordinates and lod per triangle.
	tcu::Vec3									triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	float										triLod[2]			= { de::clamp(computeNonProjectedTriLod(params.lodMode, dstSize, srcSize, triS[0]) + lodBias, params.minLod, params.maxLod),
																		de::clamp(computeNonProjectedTriLod(params.lodMode, dstSize, srcSize, triS[1]) + lodBias, params.minLod, params.maxLod) };

	for (int y = 0; y < dst.getHeight(); y++)
	{
		for (int x = 0; x < dst.getWidth(); x++)
		{
			float	yf		= ((float)y + 0.5f) / (float)dst.getHeight();
			float	xf		= ((float)x + 0.5f) / (float)dst.getWidth();

			int		triNdx	= xf + yf >= 1.0f ? 1 : 0; // Top left fill rule.
			float	triX	= triNdx ? 1.0f-xf : xf;
			float	triY	= triNdx ? 1.0f-yf : yf;

			float	s		= triangleInterpolate(triS[triNdx].x(), triS[triNdx].y(), triS[triNdx].z(), triX, triY);
			float	lod		= triLod[triNdx];

			dst.setPixel(execSample(src, params, s, lod) * params.colorScale + params.colorBias, x, y);
		}
	}
}